

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O3

void __thiscall
Lodtalk::InstanceVariableScope::InstanceVariableScope
          (InstanceVariableScope *this,EvaluationScopePtr *parent,
          Ref<Lodtalk::ClassDescription> *classDesc)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  VMContext *pVVar3;
  
  (this->super_EvaluationScope)._vptr_EvaluationScope = (_func_int **)&PTR__EvaluationScope_001636f0
  ;
  (this->super_EvaluationScope).parentScope.
  super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (parent->super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (parent->super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->super_EvaluationScope).parentScope.
  super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (this->super_EvaluationScope)._vptr_EvaluationScope =
       (_func_int **)&PTR__InstanceVariableScope_00163768;
  (this->classDesc).reference.oop.field_0 = (classDesc->reference).oop.field_0;
  pVVar3 = getCurrentContext();
  (this->classDesc).reference.context_ = pVVar3;
  OopRef::registerSelf(&(this->classDesc).reference);
  p_Var1 = &(this->lookupCache)._M_t._M_impl.super__Rb_tree_header;
  (this->lookupCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->lookupCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->lookupCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->lookupCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->lookupCache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

InstanceVariableScope(const EvaluationScopePtr &parent, const Ref<ClassDescription> &classDesc)
		: EvaluationScope(parent), classDesc(classDesc) {}